

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O0

void kratos::VarFanOutVisitor::compute_assign_chain
               (shared_ptr<kratos::Var> *var,
               vector<std::pair<std::shared_ptr<kratos::Var>,_std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::pair<std::shared_ptr<kratos::Var>,_std::shared_ptr<kratos::AssignStmt>_>_>_>
               *queue)

{
  Var *pVVar1;
  value_type *pvVar2;
  int iVar3;
  IRNodeKind IVar4;
  int iVar5;
  uint uVar6;
  element_type *peVar7;
  undefined4 extraout_var;
  size_type sVar8;
  undefined4 extraout_var_00;
  element_type *peVar9;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  Var **ppVVar10;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  element_type *peVar11;
  void *local_90;
  pair<std::shared_ptr<kratos::Var>,_std::nullptr_t> local_88;
  enable_shared_from_this<kratos::Var> local_70 [2];
  pair<std::shared_ptr<kratos::Var>,_std::shared_ptr<kratos::AssignStmt>_> local_50;
  Var *local_30;
  Var *sink_var;
  __shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_20;
  value_type *stmt;
  vector<std::pair<std::shared_ptr<kratos::Var>,_std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::pair<std::shared_ptr<kratos::Var>,_std::shared_ptr<kratos::AssignStmt>_>_>_>
  *queue_local;
  shared_ptr<kratos::Var> *var_local;
  
  stmt = (value_type *)queue;
  queue_local = (vector<std::pair<std::shared_ptr<kratos::Var>,_std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::pair<std::shared_ptr<kratos::Var>,_std::shared_ptr<kratos::AssignStmt>_>_>_>
                 *)var;
  peVar7 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      var);
  iVar3 = (*(peVar7->super_IRNode)._vptr_IRNode[0xe])();
  sVar8 = std::
          unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
          ::size((unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                  *)CONCAT44(extraout_var,iVar3));
  pvVar2 = stmt;
  if (sVar8 == 1) {
    peVar7 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)queue_local);
    iVar3 = (*(peVar7->super_IRNode)._vptr_IRNode[0xe])();
    sink_var = (Var *)std::
                      unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                      ::begin((unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                               *)CONCAT44(extraout_var_00,iVar3));
    local_20 = (__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               std::__detail::_Node_const_iterator<std::shared_ptr<kratos::AssignStmt>,_true,_false>
               ::operator*((_Node_const_iterator<std::shared_ptr<kratos::AssignStmt>,_true,_false> *
                           )&sink_var);
    peVar9 = std::__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(local_20);
    iVar3 = (*(peVar9->super_Stmt).super_IRNode._vptr_IRNode[4])();
    if (CONCAT44(extraout_var_01,iVar3) != 0) {
      peVar9 = std::
               __shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(local_20);
      iVar3 = (*(peVar9->super_Stmt).super_IRNode._vptr_IRNode[4])();
      IVar4 = IRNode::ir_node_kind((IRNode *)CONCAT44(extraout_var_02,iVar3));
      if (IVar4 == GeneratorKind) {
        peVar9 = std::
                 __shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->(local_20);
        ppVVar10 = AssignStmt::left(peVar9);
        local_30 = *ppVVar10;
        iVar3 = (*(local_30->super_IRNode)._vptr_IRNode[4])();
        peVar7 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)queue_local);
        iVar5 = (*(peVar7->super_IRNode)._vptr_IRNode[4])();
        if ((CONCAT44(extraout_var_03,iVar3) == CONCAT44(extraout_var_04,iVar5)) &&
           (uVar6 = (*(local_30->super_IRNode)._vptr_IRNode[0x1d])(), (uVar6 & 1) == 0)) {
          peVar9 = std::
                   __shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->(local_20);
          ppVVar10 = AssignStmt::right(peVar9);
          pVVar1 = *ppVVar10;
          peVar11 = std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::get
                              ((__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)queue_local)
          ;
          pvVar2 = stmt;
          if (pVVar1 == peVar11) {
            std::
            make_pair<std::shared_ptr<kratos::Var>const&,std::shared_ptr<kratos::AssignStmt>const&>
                      (&local_50,(shared_ptr<kratos::Var> *)queue_local,
                       (shared_ptr<kratos::AssignStmt> *)local_20);
            std::
            vector<std::pair<std::shared_ptr<kratos::Var>,std::shared_ptr<kratos::AssignStmt>>,std::allocator<std::pair<std::shared_ptr<kratos::Var>,std::shared_ptr<kratos::AssignStmt>>>>
            ::
            emplace_back<std::pair<std::shared_ptr<kratos::Var>,std::shared_ptr<kratos::AssignStmt>>>
                      ((vector<std::pair<std::shared_ptr<kratos::Var>,std::shared_ptr<kratos::AssignStmt>>,std::allocator<std::pair<std::shared_ptr<kratos::Var>,std::shared_ptr<kratos::AssignStmt>>>>
                        *)pvVar2,&local_50);
            std::pair<std::shared_ptr<kratos::Var>,_std::shared_ptr<kratos::AssignStmt>_>::~pair
                      (&local_50);
            std::enable_shared_from_this<kratos::Var>::shared_from_this(local_70);
            compute_assign_chain
                      ((shared_ptr<kratos::Var> *)local_70,
                       (vector<std::pair<std::shared_ptr<kratos::Var>,_std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::pair<std::shared_ptr<kratos::Var>,_std::shared_ptr<kratos::AssignStmt>_>_>_>
                        *)stmt);
            std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)local_70);
          }
        }
      }
    }
  }
  else {
    local_90 = (void *)0x0;
    std::make_pair<std::shared_ptr<kratos::Var>const&,decltype(nullptr)>
              (&local_88,(shared_ptr<kratos::Var> *)queue_local,&local_90);
    std::
    vector<std::pair<std::shared_ptr<kratos::Var>,std::shared_ptr<kratos::AssignStmt>>,std::allocator<std::pair<std::shared_ptr<kratos::Var>,std::shared_ptr<kratos::AssignStmt>>>>
    ::emplace_back<std::pair<std::shared_ptr<kratos::Var>,decltype(nullptr)>>
              ((vector<std::pair<std::shared_ptr<kratos::Var>,std::shared_ptr<kratos::AssignStmt>>,std::allocator<std::pair<std::shared_ptr<kratos::Var>,std::shared_ptr<kratos::AssignStmt>>>>
                *)pvVar2,&local_88);
    std::pair<std::shared_ptr<kratos::Var>,_std::nullptr_t>::~pair(&local_88);
  }
  return;
}

Assistant:

void static compute_assign_chain(
        const std::shared_ptr<Var>& var,
        std::vector<std::pair<std::shared_ptr<Var>, std::shared_ptr<AssignStmt>>>& queue) {
        if (var->sinks().size() == 1) {
            auto const& stmt = *(var->sinks().begin());
            if (!stmt->parent()) return;
            if (stmt->parent()->ir_node_kind() == IRNodeKind::GeneratorKind) {
                auto* sink_var = stmt->left();
                if (sink_var->parent() != var->parent() || sink_var->is_interface()) {
                    // not the same parent
                    return;
                }
                // FIXME: need to re-work on fanout one wire removal
                //  For now disable the expression based search
                if (stmt->right() != var.get()) {
                    // expr based
                    return;
                }
                queue.emplace_back(std::make_pair(var, stmt));
                compute_assign_chain(sink_var->shared_from_this(), queue);
            }
        } else {
            queue.emplace_back(std::make_pair(var, nullptr));
        }
    }